

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_api.cc
# Opt level: O0

int XLearnSetStr(XL *out,char *key,char *value)

{
  int iVar1;
  HyperParam *pHVar2;
  char *in_RDX;
  char *in_RSI;
  undefined8 *in_RDI;
  runtime_error *_except_;
  XLearn *xl;
  allocator local_149;
  string local_148 [39];
  allocator local_121;
  string local_120 [39];
  allocator local_f9;
  string local_f8 [39];
  allocator local_d1;
  string local_d0 [39];
  allocator local_a9;
  string local_a8 [39];
  allocator local_81;
  string local_80 [55];
  allocator local_49;
  string local_48 [32];
  XLearn *local_28;
  char *local_20;
  char *local_18;
  
  local_28 = (XLearn *)*in_RDI;
  local_20 = in_RDX;
  local_18 = in_RSI;
  iVar1 = strcmp(in_RSI,"task");
  if (iVar1 == 0) {
    iVar1 = strcmp(local_20,"binary");
    if (iVar1 == 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_48,"cross-entropy",&local_49);
      pHVar2 = XLearn::GetHyperParam(local_28);
      std::__cxx11::string::operator=((string *)&pHVar2->loss_func,local_48);
      std::__cxx11::string::~string(local_48);
      std::allocator<char>::~allocator((allocator<char> *)&local_49);
    }
    else {
      iVar1 = strcmp(local_20,"reg");
      if (iVar1 == 0) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_80,"squared",&local_81);
        pHVar2 = XLearn::GetHyperParam(local_28);
        std::__cxx11::string::operator=((string *)&pHVar2->loss_func,local_80);
        std::__cxx11::string::~string(local_80);
        std::allocator<char>::~allocator((allocator<char> *)&local_81);
      }
      else {
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_a8,"unknow",&local_a9);
        pHVar2 = XLearn::GetHyperParam(local_28);
        std::__cxx11::string::operator=((string *)&pHVar2->loss_func,local_a8);
        std::__cxx11::string::~string(local_a8);
        std::allocator<char>::~allocator((allocator<char> *)&local_a9);
      }
    }
  }
  else {
    iVar1 = strcmp(local_18,"metric");
    if (iVar1 == 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_d0,local_20,&local_d1);
      pHVar2 = XLearn::GetHyperParam(local_28);
      std::__cxx11::string::operator=((string *)&pHVar2->metric,local_d0);
      std::__cxx11::string::~string(local_d0);
      std::allocator<char>::~allocator((allocator<char> *)&local_d1);
    }
    else {
      iVar1 = strcmp(local_18,"log");
      if (iVar1 == 0) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_f8,local_20,&local_f9);
        pHVar2 = XLearn::GetHyperParam(local_28);
        std::__cxx11::string::operator=((string *)&pHVar2->log_file,local_f8);
        std::__cxx11::string::~string(local_f8);
        std::allocator<char>::~allocator((allocator<char> *)&local_f9);
      }
      else {
        iVar1 = strcmp(local_18,"loss");
        if (iVar1 == 0) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_120,local_20,&local_121);
          pHVar2 = XLearn::GetHyperParam(local_28);
          std::__cxx11::string::operator=((string *)&pHVar2->loss_func,local_120);
          std::__cxx11::string::~string(local_120);
          std::allocator<char>::~allocator((allocator<char> *)&local_121);
        }
        else {
          iVar1 = strcmp(local_18,"opt");
          if (iVar1 == 0) {
            std::allocator<char>::allocator();
            std::__cxx11::string::string(local_148,local_20,&local_149);
            pHVar2 = XLearn::GetHyperParam(local_28);
            std::__cxx11::string::operator=((string *)&pHVar2->opt_type,local_148);
            std::__cxx11::string::~string(local_148);
            std::allocator<char>::~allocator((allocator<char> *)&local_149);
          }
        }
      }
    }
  }
  return 0;
}

Assistant:

XL_DLL int XLearnSetStr(XL *out, const char *key, const char *value) {
  API_BEGIN();
  XLearn* xl = reinterpret_cast<XLearn*>(*out);
  if (strcmp(key, "task") == 0) {
    if (strcmp(value, "binary") == 0) {
      xl->GetHyperParam().loss_func = std::string("cross-entropy");
    } else if (strcmp(value, "reg") == 0) {
      xl->GetHyperParam().loss_func = std::string("squared");
    } else {
      xl->GetHyperParam().loss_func = std::string("unknow");
    }
  } else if (strcmp(key, "metric") == 0) {
    xl->GetHyperParam().metric = std::string(value);
  } else if (strcmp(key, "log") == 0) {
    xl->GetHyperParam().log_file = std::string(value);
  } else if (strcmp(key, "loss") == 0) {
    xl->GetHyperParam().loss_func = std::string(value);
  } else if (strcmp(key, "opt") == 0) {
    xl->GetHyperParam().opt_type = std::string(value);
  }
  API_END();
}